

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O0

FabOnDisk * amrex::VisMF::Write(FArrayBox *fab,string *filename,ostream *os,Long *bytes)

{
  Long LVar1;
  FabOnDisk *in_RDI;
  long *in_R8;
  FabOnDisk *fab_on_disk;
  ostream *in_stack_ffffffffffffffa0;
  FabOnDisk *this;
  
  this = in_RDI;
  FileOffset(in_stack_ffffffffffffffa0);
  FabOnDisk::FabOnDisk(this,&in_RDI->m_name,(Long)in_stack_ffffffffffffffa0);
  FArrayBox::writeOn((FArrayBox *)this,(ostream *)in_RDI);
  LVar1 = FileOffset(in_stack_ffffffffffffffa0);
  *in_R8 = (LVar1 - this->m_head) + *in_R8;
  return in_RDI;
}

Assistant:

VisMF::FabOnDisk
VisMF::Write (const FArrayBox&   fab,
              const std::string& filename,
              std::ostream&      os,
              Long&              bytes)
{
//    BL_PROFILE("VisMF::Write_fab");
    VisMF::FabOnDisk fab_on_disk(filename, VisMF::FileOffset(os));

    fab.writeOn(os);
    //
    // Add in the number of bytes in the FAB including the FAB header.
    //
    bytes += (VisMF::FileOffset(os) - fab_on_disk.m_head);

    return fab_on_disk;
}